

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportTryCompileFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,
          cmGeneratorTarget *param_1,cmFileSet *fileSet,cmTargetExport *param_3)

{
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *r;
  WrapQuotes wrapQuotes;
  string_view str;
  string local_60;
  undefined1 local_40 [16];
  cmTargetExport *local_30;
  cmTargetExport *param_3_local;
  cmFileSet *fileSet_local;
  cmGeneratorTarget *param_1_local;
  cmExportTryCompileFileGenerator *this_local;
  
  wrapQuotes = (WrapQuotes)param_3;
  local_30 = param_3;
  param_3_local = (cmTargetExport *)fileSet;
  fileSet_local = (cmFileSet *)param_1;
  param_1_local = (cmGeneratorTarget *)this;
  this_local = (cmExportTryCompileFileGenerator *)__return_storage_ptr__;
  r = cmFileSet::GetDirectoryEntries_abi_cxx11_(fileSet);
  cmList::
  to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
            (&local_60,r);
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  str._M_len = local_40._8_8_;
  str._M_str = (char *)0x0;
  cmOutputConverter::EscapeForCMake_abi_cxx11_(__return_storage_ptr__,local_40._0_8_,str,wrapQuotes)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* /*gte*/, cmFileSet* fileSet, cmTargetExport* /*te*/)
{
  return cmOutputConverter::EscapeForCMake(
    cmList::to_string(fileSet->GetDirectoryEntries()));
}